

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

void Abc_ManResubDivsD(Abc_ManRes_t *p,int Required)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  p->vDivs2UP0->nSize = 0;
  p->vDivs2UP1->nSize = 0;
  p->vDivs2UN0->nSize = 0;
  p->vDivs2UN1->nSize = 0;
  pVVar8 = p->vDivs1B;
  uVar12 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    pvVar2 = (p->pRoot->field_5).pData;
    lVar14 = 1;
    lVar13 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar13];
      if (((int)(*(uint *)((long)pvVar3 + 0x14) >> 0xc) <= Required + -2) &&
         (lVar13 + 1 < (long)(int)uVar12)) {
        lVar4 = *(long *)((long)pvVar3 + 0x38);
        pvVar10 = (void *)((ulong)pvVar3 ^ 1);
        lVar15 = lVar14;
        do {
          pvVar5 = pVVar8->pArray[lVar15];
          if ((int)(*(uint *)((long)pvVar5 + 0x14) >> 0xc) <= Required + -2) {
            lVar6 = *(long *)((long)pvVar5 + 0x38);
            pVVar8 = p->vDivs2UP0;
            uVar7 = pVVar8->nSize;
            if ((int)uVar7 < 500) {
              uVar12 = (ulong)p->nWords;
              if ((long)uVar12 < 1) {
                uVar11 = 0;
LAB_0029af0a:
                if ((int)uVar11 == p->nWords) goto LAB_0029af12;
              }
              else {
                uVar11 = 0;
                do {
                  if ((p->pCareSet[uVar11] &
                      ~*(uint *)((long)pvVar2 + uVar11 * 4) &
                      *(uint *)(lVar6 + uVar11 * 4) & *(uint *)(lVar4 + uVar11 * 4)) != 0)
                  goto LAB_0029af0a;
                  uVar11 = uVar11 + 1;
                } while (uVar12 != uVar11);
LAB_0029af12:
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar3;
                pVVar8 = p->vDivs2UP1;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar5;
                uVar12 = (ulong)(uint)p->nWords;
              }
              if ((int)uVar12 < 1) {
                uVar11 = 0;
LAB_0029b04b:
                if ((int)uVar11 == (int)uVar12) goto LAB_0029b053;
              }
              else {
                uVar11 = 0;
                do {
                  if ((p->pCareSet[uVar11] &
                      ~(*(uint *)((long)pvVar2 + uVar11 * 4) | *(uint *)(lVar4 + uVar11 * 4)) &
                      *(uint *)(lVar6 + uVar11 * 4)) != 0) goto LAB_0029b04b;
                  uVar11 = uVar11 + 1;
                } while ((uVar12 & 0xffffffff) != uVar11);
LAB_0029b053:
                pVVar8 = p->vDivs2UP0;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar10;
                pVVar8 = p->vDivs2UP1;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar5;
                uVar12 = (ulong)(uint)p->nWords;
              }
              uVar7 = (uint)uVar12;
              if ((int)uVar7 < 1) {
                uVar11 = 0;
LAB_0029b191:
                if ((uint)uVar11 == uVar7) goto LAB_0029b199;
              }
              else {
                uVar11 = 0;
                do {
                  if ((p->pCareSet[uVar11] &
                      ~(*(uint *)((long)pvVar2 + uVar11 * 4) | *(uint *)(lVar6 + uVar11 * 4)) &
                      *(uint *)(lVar4 + uVar11 * 4)) != 0) goto LAB_0029b191;
                  uVar11 = uVar11 + 1;
                } while ((uVar12 & 0xffffffff) != uVar11);
LAB_0029b199:
                pVVar8 = p->vDivs2UP0;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar3;
                pVVar8 = p->vDivs2UP1;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = (void *)((ulong)pvVar5 ^ 1);
                uVar7 = p->nWords;
              }
              if ((int)uVar7 < 1) {
                uVar12 = 0;
LAB_0029b2e1:
                if ((uint)uVar12 != uVar7) goto LAB_0029b3fd;
              }
              else {
                uVar12 = 0;
                do {
                  if ((p->pCareSet[uVar12] &
                      ~*(uint *)((long)pvVar2 + uVar12 * 4) &
                      (*(uint *)(lVar6 + uVar12 * 4) | *(uint *)(lVar4 + uVar12 * 4))) != 0)
                  goto LAB_0029b2e1;
                  uVar12 = uVar12 + 1;
                } while (uVar7 != uVar12);
              }
              pVVar8 = p->vDivs2UP0;
              uVar7 = pVVar8->nSize;
              if (uVar7 == pVVar8->nCap) {
                if ((int)uVar7 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar7 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar1 = pVVar8->nSize;
              pVVar8->nSize = iVar1 + 1;
              ppvVar9[iVar1] = pvVar10;
              pVVar8 = p->vDivs2UP1;
              uVar7 = pVVar8->nSize;
              if (uVar7 == pVVar8->nCap) {
                if ((int)uVar7 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar7 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar1 = pVVar8->nSize;
              pVVar8->nSize = iVar1 + 1;
              ppvVar9[iVar1] = (void *)((ulong)pvVar5 ^ 1);
            }
LAB_0029b3fd:
            pVVar8 = p->vDivs2UN0;
            uVar7 = pVVar8->nSize;
            if ((int)uVar7 < 500) {
              uVar12 = (ulong)p->nWords;
              if ((long)uVar12 < 1) {
                uVar11 = 0;
LAB_0029b440:
                if ((int)uVar11 == p->nWords) goto LAB_0029b448;
              }
              else {
                uVar11 = 0;
                do {
                  if ((p->pCareSet[uVar11] &
                      ~(*(uint *)(lVar6 + uVar11 * 4) & *(uint *)(lVar4 + uVar11 * 4)) &
                      *(uint *)((long)pvVar2 + uVar11 * 4)) != 0) goto LAB_0029b440;
                  uVar11 = uVar11 + 1;
                } while (uVar12 != uVar11);
LAB_0029b448:
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar3;
                pVVar8 = p->vDivs2UN1;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar5;
                uVar12 = (ulong)(uint)p->nWords;
              }
              if ((int)uVar12 < 1) {
                uVar11 = 0;
LAB_0029b581:
                if ((int)uVar11 == (int)uVar12) goto LAB_0029b589;
              }
              else {
                uVar11 = 0;
                do {
                  if ((p->pCareSet[uVar11] &
                      (~*(uint *)(lVar6 + uVar11 * 4) | *(uint *)(lVar4 + uVar11 * 4)) &
                      *(uint *)((long)pvVar2 + uVar11 * 4)) != 0) goto LAB_0029b581;
                  uVar11 = uVar11 + 1;
                } while ((uVar12 & 0xffffffff) != uVar11);
LAB_0029b589:
                pVVar8 = p->vDivs2UN0;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar10;
                pVVar8 = p->vDivs2UN1;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar5;
                uVar12 = (ulong)(uint)p->nWords;
              }
              uVar7 = (uint)uVar12;
              if ((int)uVar7 < 1) {
                uVar11 = 0;
LAB_0029b6c7:
                if ((uint)uVar11 == uVar7) goto LAB_0029b6cf;
              }
              else {
                uVar11 = 0;
                do {
                  if ((p->pCareSet[uVar11] &
                      (~*(uint *)(lVar4 + uVar11 * 4) | *(uint *)(lVar6 + uVar11 * 4)) &
                      *(uint *)((long)pvVar2 + uVar11 * 4)) != 0) goto LAB_0029b6c7;
                  uVar11 = uVar11 + 1;
                } while ((uVar12 & 0xffffffff) != uVar11);
LAB_0029b6cf:
                pVVar8 = p->vDivs2UN0;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = pvVar3;
                pVVar8 = p->vDivs2UN1;
                uVar7 = pVVar8->nSize;
                if (uVar7 == pVVar8->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar7 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar1 = pVVar8->nSize;
                pVVar8->nSize = iVar1 + 1;
                ppvVar9[iVar1] = (void *)((ulong)pvVar5 ^ 1);
                uVar7 = p->nWords;
              }
              if ((int)uVar7 < 1) {
                uVar12 = 0;
LAB_0029b814:
                if ((uint)uVar12 != uVar7) goto LAB_0029b92d;
              }
              else {
                uVar12 = 0;
                do {
                  if ((p->pCareSet[uVar12] &
                      ~(*(uint *)(lVar6 + uVar12 * 4) | *(uint *)(lVar4 + uVar12 * 4)) &
                      *(uint *)((long)pvVar2 + uVar12 * 4)) != 0) goto LAB_0029b814;
                  uVar12 = uVar12 + 1;
                } while (uVar7 != uVar12);
              }
              pVVar8 = p->vDivs2UN0;
              uVar7 = pVVar8->nSize;
              if (uVar7 == pVVar8->nCap) {
                if ((int)uVar7 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar7 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar1 = pVVar8->nSize;
              pVVar8->nSize = iVar1 + 1;
              ppvVar9[iVar1] = pvVar10;
              pVVar8 = p->vDivs2UN1;
              uVar7 = pVVar8->nSize;
              if (uVar7 == pVVar8->nCap) {
                if ((int)uVar7 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = 0x10;
                }
                else {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar7 << 4);
                  }
                  pVVar8->pArray = ppvVar9;
                  pVVar8->nCap = uVar7 * 2;
                }
              }
              else {
                ppvVar9 = pVVar8->pArray;
              }
              iVar1 = pVVar8->nSize;
              pVVar8->nSize = iVar1 + 1;
              ppvVar9[iVar1] = (void *)((ulong)pvVar5 ^ 1);
            }
          }
LAB_0029b92d:
          lVar15 = lVar15 + 1;
          pVVar8 = p->vDivs1B;
        } while ((int)lVar15 < pVVar8->nSize);
      }
      lVar13 = lVar13 + 1;
      uVar12 = (ulong)pVVar8->nSize;
      lVar14 = lVar14 + 1;
    } while (lVar13 < (long)uVar12);
  }
  return;
}

Assistant:

void Abc_ManResubDivsD( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1;
    unsigned * puData0, * puData1, * puDataR;
    int i, k, w;
    Vec_PtrClear( p->vDivs2UP0 );
    Vec_PtrClear( p->vDivs2UP1 );
    Vec_PtrClear( p->vDivs2UN0 );
    Vec_PtrClear( p->vDivs2UN1 );
    puDataR = (unsigned *)p->pRoot->pData;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1B, pObj0, i )
    {
        if ( (int)pObj0->Level > Required - 2 )
            continue;

        puData0 = (unsigned *)pObj0->pData;
        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs1B, pObj1, k, i + 1 )
        {
            if ( (int)pObj1->Level > Required - 2 )
                continue;

            puData1 = (unsigned *)pObj1->pData;

            if ( Vec_PtrSize(p->vDivs2UP0) < ABC_RS_DIV2_MAX )
            {
                // get positive unate divisors
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] & puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] & puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, pObj0 );
                    Vec_PtrPush( p->vDivs2UP1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (~puData0[w] & puData1[w]) & ~puDataR[w] )
                    if ( (~puData0[w] & puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UP1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] & ~puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] & ~puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, pObj0 );
                    Vec_PtrPush( p->vDivs2UP1, Abc_ObjNot(pObj1) );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] | puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] | puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UP1, Abc_ObjNot(pObj1) );
                }
            }

            if ( Vec_PtrSize(p->vDivs2UN0) < ABC_RS_DIV2_MAX )
            {
                // get negative unate divisors
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] & puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] & puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, pObj0 );
                    Vec_PtrPush( p->vDivs2UN1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(~puData0[w] & puData1[w]) & puDataR[w] )
                    if ( ~(~puData0[w] & puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UN1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] & ~puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] & ~puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, pObj0 );
                    Vec_PtrPush( p->vDivs2UN1, Abc_ObjNot(pObj1) );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] | puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] | puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UN1, Abc_ObjNot(pObj1) );
                }
            }
        }
    }
//    printf( "%d %d  ", Vec_PtrSize(p->vDivs2UP0), Vec_PtrSize(p->vDivs2UN0) );
}